

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeMsg.cpp
# Opt level: O3

void MsgHelper::printMsg(PipeMsg *msg)

{
  uint8_t uVar1;
  ulong uVar2;
  char *__format;
  
  switch(msg->type) {
  case C2S_REQUEST:
    break;
  case S2C_RESPONSE:
    printf("[S2C_RESPONSE]: CODE:%d\n",(ulong)(msg->field_1).c2s_request.CMD);
    return;
  case SEND_TCP_DATA:
    printf("[TCP_DATA]: METHOD %d DATA %d\n",(ulong)(byte)(msg->field_1).c2s_request.ADDR.PORT,
           (ulong)(msg->field_1).common_tcp_data.LEN);
    return;
  case C2S_UDP_DATA:
  case S2C_UDP_DATA:
    printf("[UDP_DATA]: %s:%d -> METHOD %d DATA %d\n",(undefined1 *)((long)&msg->field_1 + 0x14),
           (ulong)*(ushort *)((long)&msg->field_1 + 0x12),
           (ulong)(byte)(msg->field_1).c2s_request.ADDR.PORT,
           (ulong)(msg->field_1).common_tcp_data.LEN);
    return;
  case S2C_DISCONNECT:
    puts("[S2C_DISCONNECT]");
    return;
  case S2C_CANNOT_RESOLVE_ADDR:
    puts("[S2C_CANNOT_RESOLVE_ADDR]");
    return;
  default:
    return;
  }
  uVar1 = (msg->field_1).c2s_request.CMD;
  if (uVar1 == '\x03') {
    uVar2 = (ulong)*(ushort *)((long)&msg->field_1 + 4);
    __format = "[C2S_REQUEST]: UDP %s:%d\n";
  }
  else if (uVar1 == '\x02') {
    uVar2 = (ulong)*(ushort *)((long)&msg->field_1 + 4);
    __format = "[C2S_REQUEST]: BIND %s:%d\n";
  }
  else {
    if (uVar1 != '\x01') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/PipeMsg.cpp"
                    ,0x140,"static void MsgHelper::printMsg(PipeMsg *)");
    }
    uVar2 = (ulong)*(ushort *)((long)&msg->field_1 + 4);
    __format = "[C2S_REQUEST]: CONNECT %s:%d\n";
  }
  printf(__format,(undefined1 *)((long)&msg->field_1 + 6),uVar2);
  return;
}

Assistant:

void MsgHelper::printMsg(PipeMsg* msg)
{
	switch(msg->type)
	{
		case PIPEMSG_TYPE::C2S_REQUEST:
		{
			const auto& info = msg->c2s_request.ADDR;

			if(msg->c2s_request.CMD == SOKS5_CMD_CONNECT)
				printf("[C2S_REQUEST]: CONNECT %s:%d\n", info.ADDR, (int32_t)info.PORT);
			else if(msg->c2s_request.CMD == SOKS5_CMD_BIND)
				printf("[C2S_REQUEST]: BIND %s:%d\n", info.ADDR, (int32_t)info.PORT);
			else if(msg->c2s_request.CMD == SOKS5_CMD_UDP)
				printf("[C2S_REQUEST]: UDP %s:%d\n", info.ADDR, (int32_t)info.PORT);
			else
				assert(0);
		}break;
		case PIPEMSG_TYPE::S2C_RESPONSE:
		{
			printf("[S2C_RESPONSE]: CODE:%d\n", (uint8_t)msg->s2c_response.CODE);
		}break;
		case PIPEMSG_TYPE::SEND_TCP_DATA:
		{
			printf("[TCP_DATA]: METHOD %d DATA %d\n", msg->common_tcp_data.METHOD, msg->common_tcp_data.LEN);
		}break;
		case PIPEMSG_TYPE::C2S_UDP_DATA:
		case PIPEMSG_TYPE::S2C_UDP_DATA:
		{
			printf("[UDP_DATA]: %s:%d -> METHOD %d DATA %d\n", msg->common_udp_data.ADDR.ADDR, (int32_t)msg->common_udp_data.ADDR.PORT, msg->common_udp_data.METHOD, msg->common_udp_data.LEN);
		}break;
		case PIPEMSG_TYPE::S2C_DISCONNECT:
		{
			printf("[S2C_DISCONNECT]\n");
		}break;
		case PIPEMSG_TYPE::S2C_CANNOT_RESOLVE_ADDR:
		{
			printf("[S2C_CANNOT_RESOLVE_ADDR]\n");			
		}break;
	}
}